

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O2

void __thiscall
FIX44::MessageCracker::onMessage(MessageCracker *this,AssignmentReport *param_1,SessionID *param_2)

{
  UnsupportedMessageType *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (UnsupportedMessageType *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  FIX::UnsupportedMessageType::UnsupportedMessageType(this_00,&local_38);
  __cxa_throw(this_00,&FIX::UnsupportedMessageType::typeinfo,FIX::Exception::~Exception);
}

Assistant:

virtual void onMessage( const AssignmentReport&, const FIX::SessionID& ) 
    { throw FIX::UnsupportedMessageType(); }